

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# znzlib.c
# Opt level: O2

int znzprintf(znzFile stream,char *format,...)

{
  char in_AL;
  int iVar1;
  size_t sVar2;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (stream == (znzFile)0x0) {
    iVar1 = 0;
  }
  else {
    va[0].reg_save_area = local_d8;
    va[0].overflow_arg_area = &stack0x00000008;
    va[0].gp_offset = 0x10;
    va[0].fp_offset = 0x30;
    local_c8 = in_RDX;
    local_c0 = in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    if (stream->zfptr == (gzFile)0x0) {
      iVar1 = vfprintf((FILE *)stream->nzfptr,format,va);
    }
    else {
      sVar2 = strlen(format);
      uVar3 = (int)sVar2 + 1000000;
      __s = (char *)calloc(1,(long)(int)uVar3);
      if (__s == (char *)0x0) {
        iVar1 = 0;
        fprintf(_stderr,"** ERROR: znzprintf failed to alloc %d bytes\n",(ulong)uVar3);
      }
      else {
        vsprintf(__s,format,va);
        iVar1 = gzprintf(stream->zfptr,"%s",__s);
        free(__s);
      }
    }
  }
  return iVar1;
}

Assistant:

int znzprintf(znzFile stream, const char *format, ...)
{
  int retval=0;
  char *tmpstr;
  va_list va;
  if (stream==NULL) { return 0; }
  va_start(va, format);
#ifdef HAVE_ZLIB
  if (stream->zfptr!=NULL) {
    int size;  /* local to HAVE_ZLIB block */
    size = strlen(format) + 1000000;  /* overkill I hope */
    tmpstr = (char *)calloc(1, size);
    if( tmpstr == NULL ){
       fprintf(stderr,"** ERROR: znzprintf failed to alloc %d bytes\n", size);
       return retval;
    }
    vsprintf(tmpstr,format,va);
    retval=gzprintf(stream->zfptr,"%s",tmpstr);
    free(tmpstr);
  } else
#endif
  {
   retval=vfprintf(stream->nzfptr,format,va);
  }
  va_end(va);
  return retval;
}